

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

double calculate_sd<sparse_parameters>(vw *param_1,sparse_parameters *weights)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  sparse_iterator<float> __first;
  sparse_iterator<float> __first_00;
  allocator_type local_39;
  anon_class_8_1_898ec0c3 local_38;
  vector<double,_std::allocator<double>_> diff;
  
  iVar2 = 1 << ((byte)weights->_stride_shift & 0x1f);
  std::
  for_each<sparse_iterator<float>,calculate_sd<sparse_parameters>(vw&,sparse_parameters&)::_lambda(float)_1_>
            ((weights->_map)._M_h._M_before_begin._M_nxt,iVar2,0,iVar2);
  __first._stride = 1 << ((byte)weights->_stride_shift & 0x1f);
  __first._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (weights->_map)._M_h._M_before_begin._M_nxt;
  __first._12_4_ = 0;
  dVar3 = std::accumulate<sparse_iterator<float>,double>
                    (__first,(sparse_iterator<float>)(ZEXT416(__first._stride) << 0x40),0.0);
  local_38.mean = dVar3 / (double)calculate_sd<sparse_parameters>::my_size;
  std::vector<double,_std::allocator<double>_>::vector
            (&diff,(long)calculate_sd<sparse_parameters>::my_size,&local_39);
  uVar1 = 1 << ((byte)weights->_stride_shift & 0x1f);
  __first_00._stride = uVar1;
  __first_00._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
       = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
         (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
         (weights->_map)._M_h._M_before_begin._M_nxt;
  __first_00._12_4_ = 0;
  std::
  transform<sparse_iterator<float>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,calculate_sd<sparse_parameters>(vw&,sparse_parameters&)::_lambda(double)_1_>
            (__first_00,(sparse_iterator<float>)(ZEXT416(uVar1) << 0x40),
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,local_38);
  dVar3 = 0.0;
  for (; diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    dVar3 = dVar3 + *diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start *
                    *diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  dVar3 = dVar3 / (double)calculate_sd<sparse_parameters>::my_size;
  if (dVar3 < 0.0) {
    local_38.mean = sqrt(dVar3);
  }
  else {
    local_38.mean = SQRT(dVar3);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&diff.super__Vector_base<double,_std::allocator<double>_>);
  return local_38.mean;
}

Assistant:

double calculate_sd(vw& /* all */, T& weights)
{
  static int my_size = 0;
  for_each(weights.begin(), weights.end(), [](float /* v */) { my_size += 1; });
  double sum = accumulate(weights.begin(), weights.end(), 0.0);
  double mean = sum / my_size;
  vector<double> diff(my_size);
  transform(weights.begin(), weights.end(), diff.begin(), [mean](double x) { return x - mean; });
  double sq_sum = inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
  return sqrt(sq_sum / my_size);
}